

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeMemGetPitchFor2dImage
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,size_t imageWidth,
          size_t imageHeight,uint elementSizeInBytes,size_t *rowPitch)

{
  _func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_unsigned_long_unsigned_long_uint_unsigned_long_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_130;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_118;
  undefined1 local_100 [8];
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnMemGetPitchFor2dImageCb_t epilogue_callback_ptr;
  ze_pfnMemGetPitchFor2dImageCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_mem_get_pitch_for2d_image_params_t tracerParams;
  ze_pfnMemGetPitchFor2dImage_t pfnGetPitchFor2dImage;
  size_t *rowPitch_local;
  size_t sStack_30;
  uint elementSizeInBytes_local;
  size_t imageHeight_local;
  size_t imageWidth_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if (DAT_002da648 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr_unsigned_long_unsigned_long_uint_unsigned_long_ptr
       *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnGetPitchFor2dImage = (ze_pfnMemGetPitchFor2dImage_t)rowPitch;
    rowPitch_local._4_4_ = elementSizeInBytes;
    sStack_30 = imageHeight;
    imageHeight_local = imageWidth;
    imageWidth_local = (size_t)hDevice;
    hDevice_local = (ze_device_handle_t)hContext;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&hDevice_local;
      APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnMemGetPitchFor2dImageCb_t)0x0;
            prologueCallbackPtr < (ze_pfnMemGetPitchFor2dImageCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x568);
          p_Var1 = *(_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xbc0);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_100 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_100
                     );
        }
      }
      zeApiPtr = DAT_002da648;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_118,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_130,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,unsigned_long,unsigned_long,unsigned_int,unsigned_long*),_ze_mem_get_pitch_for2d_image_params_t*,void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_get_pitch_for2d_image_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,unsigned_long&,unsigned_long&,unsigned_int&,unsigned_long*&>
                     (zeApiPtr,(_ze_mem_get_pitch_for2d_image_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_mem_get_pitch_for2d_image_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_118,&local_130,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_device_handle_t **)&imageWidth_local,&imageHeight_local,
                      &stack0xffffffffffffffd0,(uint *)((long)&rowPitch_local + 4),
                      (unsigned_long **)&pfnGetPitchFor2dImage);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_130);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_118);
      APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_get_pitch_for2d_image_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hContext_local._4_4_ =
           (*DAT_002da648)((_ze_context_handle_t *)hDevice_local,
                           (_ze_device_handle_t *)imageWidth_local,imageHeight_local,sStack_30,
                           rowPitch_local._4_4_,(unsigned_long *)pfnGetPitchFor2dImage);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemGetPitchFor2dImage(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        size_t imageWidth,                              ///< [in] imageWidth
        size_t imageHeight,                             ///< [in] imageHeight
        unsigned int elementSizeInBytes,                ///< [in] Element size in bytes
        size_t * rowPitch                               ///< [out] rowPitch
        )
    {
        auto pfnGetPitchFor2dImage = context.zeDdiTable.Mem.pfnGetPitchFor2dImage;

        if( nullptr == pfnGetPitchFor2dImage)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Mem.pfnGetPitchFor2dImage, hContext, hDevice, imageWidth, imageHeight, elementSizeInBytes, rowPitch);

        // capture parameters
        ze_mem_get_pitch_for2d_image_params_t tracerParams = {
            &hContext,
            &hDevice,
            &imageWidth,
            &imageHeight,
            &elementSizeInBytes,
            &rowPitch
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemGetPitchFor2dImageCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemGetPitchFor2dImageCb_t, Mem, pfnGetPitchFor2dImageCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Mem.pfnGetPitchFor2dImage,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.pimageWidth,
                                                  *tracerParams.pimageHeight,
                                                  *tracerParams.pelementSizeInBytes,
                                                  *tracerParams.prowPitch);
    }